

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O0

void freeOptions(Options *options)

{
  Options *options_local;
  
  g_strfreev(options->inputFilenames);
  options->inputFilenames = (gchar **)0x0;
  g_free(options->outputFilename);
  options->outputFilename = (gchar *)0x0;
  g_free(options->machineID);
  options->machineID = (gchar *)0x0;
  g_free(options->romDir);
  options->romDir = (gchar *)0x0;
  return;
}

Assistant:

static void freeOptions(Options *options) {
	g_strfreev(options->inputFilenames);
	options->inputFilenames = NULL;
	g_free(options->outputFilename);
	options->outputFilename = NULL;
	g_free(options->machineID);
	options->machineID = NULL;
	g_free(options->romDir);
	options->romDir = NULL;
}